

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t solaris_sparse_parse(archive_read *a,tar *tar,archive_entry *entry,char *p)

{
  wchar_t wVar1;
  archive_read *tar_00;
  char *remaining;
  char *in_RCX;
  long in_RSI;
  wchar_t hole;
  int64_t end;
  int64_t start;
  char *e;
  uint in_stack_ffffffffffffffb8;
  uint uVar2;
  uint uVar3;
  char *p_00;
  archive_read *a_00;
  wchar_t local_4;
  
  uVar3 = 1;
  if (*in_RCX == ' ') {
    tar_00 = (archive_read *)(in_RCX + 1);
    a_00 = tar_00;
    p_00 = (char *)0x0;
    while( true ) {
      while( true ) {
        uVar2 = in_stack_ffffffffffffffb8 & 0xffffff;
        if (*(char *)&(tar_00->archive).magic != '\0') {
          uVar2 = CONCAT13(*(char *)&(tar_00->archive).magic != ' ',(int3)in_stack_ffffffffffffffb8)
          ;
        }
        if ((char)(uVar2 >> 0x18) == '\0') break;
        if ((*(char *)&(tar_00->archive).magic < '0') || ('9' < *(char *)&(tar_00->archive).magic))
        {
          return L'\xffffffec';
        }
        tar_00 = (archive_read *)((long)&(tar_00->archive).magic + 1);
        in_stack_ffffffffffffffb8 = uVar2;
      }
      remaining = (char *)tar_atol10(p_00,CONCAT44(uVar3,uVar2));
      if ((long)remaining < 0) {
        return L'\xffffffec';
      }
      if ((long)p_00 < (long)remaining) {
        wVar1 = gnu_add_sparse_entry(a_00,(tar *)tar_00,(int64_t)p_00,(int64_t)remaining);
        if (wVar1 != L'\0') {
          return L'\xffffffe2';
        }
        *(uint *)(*(long *)(in_RSI + 0x140) + 0x18) = uVar3;
      }
      if (*(char *)&(tar_00->archive).magic == '\0') break;
      tar_00 = (archive_read *)((long)&(tar_00->archive).magic + 1);
      uVar3 = (uint)(uVar3 == 0);
      in_stack_ffffffffffffffb8 = uVar2;
      a_00 = tar_00;
      p_00 = remaining;
    }
    local_4 = L'\0';
  }
  else {
    local_4 = L'\xffffffec';
  }
  return local_4;
}

Assistant:

static int
solaris_sparse_parse(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const char *p)
{
	const char *e;
	int64_t start, end;
	int hole = 1;

	(void)entry; /* UNUSED */

	end = 0;
	if (*p == ' ')
		p++;
	else
		return (ARCHIVE_WARN);
	for (;;) {
		e = p;
		while (*e != '\0' && *e != ' ') {
			if (*e < '0' || *e > '9')
				return (ARCHIVE_WARN);
			e++;
		}
		start = end;
		end = tar_atol10(p, e - p);
		if (end < 0)
			return (ARCHIVE_WARN);
		if (start < end) {
			if (gnu_add_sparse_entry(a, tar, start,
			    end - start) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			tar->sparse_last->hole = hole;
		}
		if (*e == '\0')
			return (ARCHIVE_OK);
		p = e + 1;
		hole = hole == 0;
	}
}